

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

void __thiscall
cmSourceFile::cmSourceFile
          (cmSourceFile *this,cmMakefile *mf,string *name,cmSourceFileLocationKind kind)

{
  cmSourceFileLocation::cmSourceFileLocation(&this->Location,mf,name,kind);
  (this->Properties).Map_._M_h._M_buckets = &(this->Properties).Map_._M_h._M_single_bucket;
  (this->Properties).Map_._M_h._M_bucket_count = 1;
  (this->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Properties).Map_._M_h._M_element_count = 0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->CustomCommand = (cmCustomCommand *)0x0;
  (this->Extension)._M_dataplus._M_p = (pointer)&(this->Extension).field_2;
  (this->Extension)._M_string_length = 0;
  (this->Extension).field_2._M_local_buf[0] = '\0';
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  (this->Language)._M_string_length = 0;
  (this->Language).field_2._M_local_buf[0] = '\0';
  (this->FullPath)._M_dataplus._M_p = (pointer)&(this->FullPath).field_2;
  (this->FullPath)._M_string_length = 0;
  (this->FullPath).field_2._M_local_buf[0] = '\0';
  (this->ObjectLibrary)._M_dataplus._M_p = (pointer)&(this->ObjectLibrary).field_2;
  (this->ObjectLibrary)._M_string_length = 0;
  (this->ObjectLibrary).field_2._M_local_buf[0] = '\0';
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Depends).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->Depends).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  return;
}

Assistant:

cmSourceFile::cmSourceFile(cmMakefile* mf, const std::string& name,
                           cmSourceFileLocationKind kind)
  : Location(mf, name, kind)
{
}